

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_mark_stale(filemgr *file,bid_t offset,size_t length)

{
  size_t in_RDX;
  bid_t in_RSI;
  filemgr *in_RDI;
  stale_regions sr;
  size_t i;
  size_t in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  ulong local_50;
  void *local_48;
  ulong local_20;
  
  if ((in_RDI->stale_list != (list *)0x0) && (in_RDX != 0)) {
    filemgr_actual_stale_regions((stale_regions *)&stack0xffffffffffffff80,in_RDI,in_RSI,in_RDX);
    memcpy(&local_50,&stack0xffffffffffffff80,0x30);
    if (local_50 < 2) {
      if (local_50 == 1) {
        filemgr_add_stale_block
                  ((filemgr *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   in_stack_ffffffffffffff80);
      }
    }
    else {
      for (local_20 = 0; local_20 < local_50; local_20 = local_20 + 1) {
        filemgr_add_stale_block
                  ((filemgr *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   in_stack_ffffffffffffff80);
      }
      free(local_48);
    }
  }
  return;
}

Assistant:

void filemgr_mark_stale(struct filemgr *file,
                        bid_t offset,
                        size_t length)
{
    if (file->stale_list && length) {
        size_t i;
        struct stale_regions sr;

        sr = filemgr_actual_stale_regions(file, offset, length);

        if (sr.n_regions > 1) {
            for (i=0; i<sr.n_regions; ++i){
                filemgr_add_stale_block(file, sr.regions[i].pos, sr.regions[i].len);
            }
            free(sr.regions);
        } else if (sr.n_regions == 1) {
            filemgr_add_stale_block(file, sr.region.pos, sr.region.len);
        }
    }
}